

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_scriptedmarine.cpp
# Opt level: O1

int AF_A_M_Refire(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *actor;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  VMValue *pVVar8;
  AActor *pAVar9;
  char *__assertion;
  bool bVar10;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0059a1d3;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_0059a189:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0059a1d3:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                  ,0x9e,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  actor = (AActor *)(param->field_0).field_1.a;
  pVVar8 = param;
  uVar5 = numparam;
  if (actor != (AActor *)0x0) {
    if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
      (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar7 = (actor->super_DThinker).super_DObject.Class;
    bVar10 = pPVar7 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar10;
    uVar5 = (uint)bVar10;
    pVVar8 = (VMValue *)(ulong)(pPVar7 == pPVar3 || bVar10);
    if (pPVar7 != pPVar3 && !bVar10) {
      do {
        pPVar7 = pPVar7->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
        if (pPVar7 == pPVar3) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0059a1d3;
    }
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_0059a189;
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar6 = (**(code **)*puVar2)(puVar2,pVVar8,uVar5,ret);
        puVar2[1] = uVar6;
      }
      pPVar7 = (PClass *)puVar2[1];
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar3 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar3) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar10) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0059a1d3;
      }
    }
  }
  if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
     ((VVar1 != '\x03' ||
      ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
    goto LAB_0059a1d3;
  }
  if (numparam < 4) {
LAB_0059a092:
    bVar10 = false;
  }
  else {
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 != '\0') {
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                      ,0x9f,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      goto LAB_0059a092;
    }
    bVar10 = param[3].field_0.i != 0;
  }
  pAVar9 = (actor->target).field_0.p;
  if (pAVar9 != (AActor *)0x0) {
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (0 < ((actor->target).field_0.p)->health) {
        if (((!bVar10) && (actor->MissileState != (FState *)0x0)) ||
           (bVar10 = AActor::CheckMeleeRange(actor), bVar10)) {
          pAVar9 = (actor->target).field_0.p;
          if ((pAVar9 != (AActor *)0x0) &&
             (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (actor->target).field_0.p = (AActor *)0x0;
            pAVar9 = (AActor *)0x0;
          }
          bVar10 = P_CheckSight(actor,pAVar9,0);
          if ((bVar10) && (uVar5 = FRandom::GenRand32(&pr_m_refire), (uVar5 & 0xfc) != 0)) {
            return 0;
          }
        }
        goto LAB_0059a169;
      }
    }
    else {
      (actor->target).field_0.p = (AActor *)0x0;
    }
  }
  if ((((actor->MissileState != (FState *)0x0) &&
       (uVar5 = FRandom::GenRand32(&pr_m_refire), (uVar5 & 0xe0) < 0xa0)) &&
      (bVar10 = P_LookForPlayers(actor,1,(FLookExParams *)0x0), bVar10)) &&
     (bVar10 = P_CheckMissileRange(actor), bVar10)) {
    return 0;
  }
LAB_0059a169:
  AActor::SetState(actor,actor->state + 1,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_M_Refire)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_BOOL_OPT(ignoremissile)	{ ignoremissile = false; }

	if (self->target == NULL || self->target->health <= 0)
	{
		if (self->MissileState && pr_m_refire() < 160)
		{ // Look for a new target most of the time
			if (P_LookForPlayers (self, true, NULL) && P_CheckMissileRange (self))
			{ // Found somebody new and in range, so don't stop shooting
				return 0;
			}
		}
		self->SetState (self->state + 1);
		return 0;
	}
	if (((ignoremissile || self->MissileState == NULL) && !self->CheckMeleeRange ()) ||
		!P_CheckSight (self, self->target) ||
		pr_m_refire() < 4)	// Small chance of stopping even when target not dead
	{
		self->SetState (self->state + 1);
	}
	return 0;
}